

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_if.cc
# Opt level: O2

unique_ptr<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>_>
 __thiscall absl::time_internal::cctz::TimeZoneIf::Load(TimeZoneIf *this,string *name)

{
  bool bVar1;
  int iVar2;
  TimeZoneInfo *this_00;
  TimeZoneLibC *this_01;
  pointer __old_p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar2 = std::__cxx11::string::compare((ulong)name,0,(char *)0x5);
  if (iVar2 == 0) {
    this_01 = (TimeZoneLibC *)operator_new(0x10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&bStack_38,name,5,0xffffffffffffffff);
    TimeZoneLibC::TimeZoneLibC(this_01,&bStack_38);
    this->_vptr_TimeZoneIf = (_func_int **)this_01;
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  else {
    this_00 = (TimeZoneInfo *)operator_new(0xc0);
    TimeZoneInfo::TimeZoneInfo(this_00);
    bVar1 = TimeZoneInfo::Load(this_00,name);
    if (!bVar1) {
      (*(this_00->super_TimeZoneIf)._vptr_TimeZoneIf[1])(this_00);
      this_00 = (TimeZoneInfo *)0x0;
    }
    this->_vptr_TimeZoneIf = (_func_int **)this_00;
  }
  return (__uniq_ptr_data<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>,_true,_true>
          )(__uniq_ptr_data<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneIf> TimeZoneIf::Load(const std::string& name) {
  // Support "libc:localtime" and "libc:*" to access the legacy
  // localtime and UTC support respectively from the C library.
  if (name.compare(0, 5, "libc:") == 0) {
    return std::unique_ptr<TimeZoneIf>(new TimeZoneLibC(name.substr(5)));
  }

  // Otherwise use the "zoneinfo" implementation by default.
  std::unique_ptr<TimeZoneInfo> tz(new TimeZoneInfo);
  if (!tz->Load(name)) tz.reset();
  return std::unique_ptr<TimeZoneIf>(tz.release());
}